

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::handleRowObjectives
          (SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *lp)

{
  type_conflict5 tVar1;
  UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RSI;
  long in_RDI;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  int i;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  undefined4 in_stack_fffffffffffffcb8;
  int in_stack_fffffffffffffcbc;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc8;
  uint in_stack_fffffffffffffccc;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffcd0;
  int i_00;
  undefined4 in_stack_fffffffffffffcd8;
  uint in_stack_fffffffffffffcdc;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffce8;
  undefined1 *in_stack_fffffffffffffcf0;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffcf8;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffd00;
  int i_01;
  undefined8 local_2d0;
  undefined1 local_2c8 [56];
  undefined8 local_290;
  undefined1 local_288 [56];
  undefined8 local_250;
  undefined1 local_248 [56];
  undefined1 local_210 [56];
  UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_1d8;
  undefined1 local_184 [56];
  undefined1 local_14c [59];
  undefined1 local_111;
  undefined1 local_110 [48];
  undefined8 local_e0;
  uint local_d4;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_d0;
  undefined8 local_c0;
  undefined8 *local_b8;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined8 *local_a0;
  undefined1 *local_98;
  undefined8 local_90;
  undefined8 *local_88;
  undefined1 *local_80;
  undefined8 *local_78;
  undefined8 *local_70;
  undefined8 *local_68;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_59;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_28;
  undefined1 *local_20;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_d0 = in_RSI;
  local_d4 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)0x3fddf1);
  while (local_d4 = local_d4 - 1, -1 < (int)local_d4) {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::maxRowObj(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
    local_e0 = 0;
    tVar1 = boost::multiprecision::operator!=
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                       (double *)0x3fde39);
    i_00 = (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20);
    if (tVar1) {
      this_00 = (UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)operator_new(0x30);
      local_111 = 1;
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x3fde76);
      i_01 = (int)((ulong)local_110 >> 0x20);
      std::shared_ptr<soplex::Tolerances>::shared_ptr
                ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffffcc0,
                 (shared_ptr<soplex::Tolerances> *)
                 CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
      RowObjPS::RowObjPS((RowObjPS *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                         (int)((ulong)in_stack_fffffffffffffcf0 >> 0x20),
                         (int)in_stack_fffffffffffffcf0,
                         (shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffffce8);
      local_111 = 0;
      std::
      shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep>
      ::
      shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::RowObjPS,void>
                ((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                  *)in_stack_fffffffffffffcc0,
                 (RowObjPS *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
      std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x3fdee1);
      Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
      ::append((Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                *)in_stack_fffffffffffffcc0,
               (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
      in_stack_fffffffffffffd00 = local_d0;
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::rowObj((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),i_00);
      in_stack_fffffffffffffcf8 =
           (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::rhs(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
      in_stack_fffffffffffffcf0 = local_184;
      local_28 = in_stack_fffffffffffffcf8;
      local_20 = in_stack_fffffffffffffcf0;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_29,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)in_stack_fffffffffffffcf8);
      local_18 = local_28;
      local_10 = in_stack_fffffffffffffcf0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffcc0,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
      local_8 = in_stack_fffffffffffffcf0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffcc0);
      UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::UnitVectorBase(this_00,i_01);
      in_stack_fffffffffffffce8 =
           SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::lhs(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
      local_58 = in_stack_fffffffffffffce8;
      local_50 = local_210;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_59,in_stack_fffffffffffffce8);
      local_48 = local_58;
      local_40 = local_210;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffcc0,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
      local_38 = local_210;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffcc0);
      (*(in_stack_fffffffffffffd00->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0xb])
                (in_stack_fffffffffffffd00,local_14c,local_184,&local_1d8,local_210,0);
      UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::~UnitVectorBase(&local_1d8);
      local_250 = 0;
      local_b0 = local_248;
      local_b8 = &local_250;
      local_c0 = 0;
      in_stack_fffffffffffffcd0 = local_d0;
      in_stack_fffffffffffffcdc = local_d4;
      local_68 = local_b8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)local_d0,
                 (double)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                 in_stack_fffffffffffffcc0);
      local_290 = 0;
      local_98 = local_288;
      local_a0 = &local_290;
      local_a8 = 0;
      local_70 = local_a0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffcd0,
                 (double)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                 in_stack_fffffffffffffcc0);
      (*(in_stack_fffffffffffffcd0->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x39])
                (in_stack_fffffffffffffcd0,(ulong)in_stack_fffffffffffffcdc,local_248,local_288,0);
      local_2d0 = 0;
      local_80 = local_2c8;
      local_88 = &local_2d0;
      local_90 = 0;
      in_stack_fffffffffffffcc0 = local_d0;
      in_stack_fffffffffffffccc = local_d4;
      local_78 = local_88;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffcd0,
                 (double)CONCAT44(local_d4,in_stack_fffffffffffffcc8),local_d0);
      (*(in_stack_fffffffffffffcc0->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x3c])
                (in_stack_fffffffffffffcc0,(ulong)in_stack_fffffffffffffccc,local_2c8,0);
      *(int *)(in_RDI + 0x220) = *(int *)(in_RDI + 0x220) + 1;
      std::
      shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
      ::~shared_ptr((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                     *)0x3fe28a);
    }
  }
  return;
}

Assistant:

void SPxMainSM<R>::handleRowObjectives(SPxLPBase<R>& lp)
{
   for(int i = lp.nRows() - 1; i >= 0; --i)
   {
      if(lp.maxRowObj(i) != 0.0)
      {
         std::shared_ptr<PostStep> ptr(new RowObjPS(lp, i, lp.nCols(), this->_tolerances));
         m_hist.append(ptr);
         lp.addCol(lp.rowObj(i), -lp.rhs(i), UnitVectorBase<R>(i), -lp.lhs(i));
         lp.changeRange(i, R(0.0), R(0.0));
         lp.changeRowObj(i, R(0.0));
         m_addedcols++;
      }
   }
}